

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++:228:5)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_main_c__:228:5)>
      *this)

{
  MainFunc *pMVar1;
  char *__s;
  ArrayPtr<kj::StringPtr> *pAVar2;
  Iface *pIVar3;
  size_t sVar4;
  
  pMVar1 = (this->func).func;
  __s = **(this->func).argv;
  sVar4 = strlen(__s);
  pAVar2 = (this->func).params;
  pIVar3 = (pMVar1->impl).ptr;
  (**pIVar3->_vptr_Iface)(pIVar3,__s,sVar4 + 1,pAVar2->ptr,pAVar2->size_);
  return;
}

Assistant:

void run() override {
    func();
  }